

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

void __thiscall Catch::Clara::Parser::writeToStream(Parser *this,ostream *os)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  ulong uVar4;
  ostream *poVar5;
  string *psVar6;
  long lVar7;
  unsigned_long *puVar8;
  Column *pCVar9;
  Column local_1a0;
  Column local_168;
  Column local_130;
  Columns local_f8;
  undefined1 local_e0 [8];
  Columns row;
  HelpColumns *cols_1;
  iterator __end2_1;
  iterator __begin2_1;
  vector<Catch::Clara::Detail::HelpColumns,_std::allocator<Catch::Clara::Detail::HelpColumns>_>
  *__range2_1;
  unsigned_long local_90;
  reference local_88;
  HelpColumns *cols;
  iterator __end2;
  iterator __begin2;
  vector<Catch::Clara::Detail::HelpColumns,_std::allocator<Catch::Clara::Detail::HelpColumns>_>
  *__range2;
  size_t optWidth;
  size_t consoleWidth;
  vector<Catch::Clara::Detail::HelpColumns,_std::allocator<Catch::Clara::Detail::HelpColumns>_> rows
  ;
  Arg *arg;
  const_iterator __end3;
  const_iterator __begin3;
  vector<Catch::Clara::Arg,_std::allocator<Catch::Clara::Arg>_> *__range3;
  bool first;
  bool required;
  ostream *os_local;
  Parser *this_local;
  
  ExeName::name_abi_cxx11_(&this->m_exeName);
  uVar4 = std::__cxx11::string::empty();
  if ((uVar4 & 1) == 0) {
    poVar5 = std::operator<<(os,"usage:\n");
    poVar5 = std::operator<<(poVar5,"  ");
    psVar6 = ExeName::name_abi_cxx11_(&this->m_exeName);
    poVar5 = std::operator<<(poVar5,(string *)psVar6);
    std::operator<<(poVar5,' ');
    bVar1 = true;
    bVar3 = true;
    __end3 = std::vector<Catch::Clara::Arg,_std::allocator<Catch::Clara::Arg>_>::begin
                       (&this->m_args);
    arg = (Arg *)std::vector<Catch::Clara::Arg,_std::allocator<Catch::Clara::Arg>_>::end
                           (&this->m_args);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end3,(__normal_iterator<const_Catch::Clara::Arg_*,_std::vector<Catch::Clara::Arg,_std::allocator<Catch::Clara::Arg>_>_>
                                       *)&arg), bVar2) {
      rows.
      super__Vector_base<Catch::Clara::Detail::HelpColumns,_std::allocator<Catch::Clara::Detail::HelpColumns>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           (pointer)__gnu_cxx::
                    __normal_iterator<const_Catch::Clara::Arg_*,_std::vector<Catch::Clara::Arg,_std::allocator<Catch::Clara::Arg>_>_>
                    ::operator*(&__end3);
      if (bVar3) {
        bVar3 = false;
      }
      else {
        std::operator<<(os,' ');
      }
      bVar2 = Detail::ParserRefImpl<Catch::Clara::Arg>::isOptional
                        ((ParserRefImpl<Catch::Clara::Arg> *)
                         rows.
                         super__Vector_base<Catch::Clara::Detail::HelpColumns,_std::allocator<Catch::Clara::Detail::HelpColumns>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
      if ((bVar2) && (bVar1)) {
        std::operator<<(os,'[');
        bVar1 = false;
      }
      poVar5 = std::operator<<(os,'<');
      psVar6 = Detail::ParserRefImpl<Catch::Clara::Arg>::hint_abi_cxx11_
                         ((ParserRefImpl<Catch::Clara::Arg> *)
                          rows.
                          super__Vector_base<Catch::Clara::Detail::HelpColumns,_std::allocator<Catch::Clara::Detail::HelpColumns>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
      poVar5 = std::operator<<(poVar5,(string *)psVar6);
      std::operator<<(poVar5,'>');
      lVar7 = (**(code **)(*(long *)&(rows.
                                      super__Vector_base<Catch::Clara::Detail::HelpColumns,_std::allocator<Catch::Clara::Detail::HelpColumns>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage)->left +
                          0x20))();
      if (lVar7 == 0) {
        std::operator<<(os," ... ");
      }
      __gnu_cxx::
      __normal_iterator<const_Catch::Clara::Arg_*,_std::vector<Catch::Clara::Arg,_std::allocator<Catch::Clara::Arg>_>_>
      ::operator++(&__end3);
    }
    if (!bVar1) {
      std::operator<<(os,']');
    }
    bVar3 = std::vector<Catch::Clara::Opt,_std::allocator<Catch::Clara::Opt>_>::empty
                      (&this->m_options);
    if (!bVar3) {
      std::operator<<(os," options");
    }
    std::operator<<(os,"\n\nwhere options are:\n");
  }
  getHelpColumns((vector<Catch::Clara::Detail::HelpColumns,_std::allocator<Catch::Clara::Detail::HelpColumns>_>
                  *)&consoleWidth,this);
  optWidth = 0x50;
  __range2 = (vector<Catch::Clara::Detail::HelpColumns,_std::allocator<Catch::Clara::Detail::HelpColumns>_>
              *)0x0;
  __end2 = std::
           vector<Catch::Clara::Detail::HelpColumns,_std::allocator<Catch::Clara::Detail::HelpColumns>_>
           ::begin((vector<Catch::Clara::Detail::HelpColumns,_std::allocator<Catch::Clara::Detail::HelpColumns>_>
                    *)&consoleWidth);
  cols = (HelpColumns *)
         std::
         vector<Catch::Clara::Detail::HelpColumns,_std::allocator<Catch::Clara::Detail::HelpColumns>_>
         ::end((vector<Catch::Clara::Detail::HelpColumns,_std::allocator<Catch::Clara::Detail::HelpColumns>_>
                *)&consoleWidth);
  while (bVar3 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<Catch::Clara::Detail::HelpColumns_*,_std::vector<Catch::Clara::Detail::HelpColumns,_std::allocator<Catch::Clara::Detail::HelpColumns>_>_>
                                     *)&cols), bVar3) {
    local_88 = __gnu_cxx::
               __normal_iterator<Catch::Clara::Detail::HelpColumns_*,_std::vector<Catch::Clara::Detail::HelpColumns,_std::allocator<Catch::Clara::Detail::HelpColumns>_>_>
               ::operator*(&__end2);
    lVar7 = std::__cxx11::string::size();
    local_90 = lVar7 + 2;
    puVar8 = std::max<unsigned_long>((unsigned_long *)&__range2,&local_90);
    __range2 = (vector<Catch::Clara::Detail::HelpColumns,_std::allocator<Catch::Clara::Detail::HelpColumns>_>
                *)*puVar8;
    __gnu_cxx::
    __normal_iterator<Catch::Clara::Detail::HelpColumns_*,_std::vector<Catch::Clara::Detail::HelpColumns,_std::allocator<Catch::Clara::Detail::HelpColumns>_>_>
    ::operator++(&__end2);
  }
  __range2_1 = (vector<Catch::Clara::Detail::HelpColumns,_std::allocator<Catch::Clara::Detail::HelpColumns>_>
                *)(optWidth >> 1);
  puVar8 = std::min<unsigned_long>((unsigned_long *)&__range2,(unsigned_long *)&__range2_1);
  __range2 = (vector<Catch::Clara::Detail::HelpColumns,_std::allocator<Catch::Clara::Detail::HelpColumns>_>
              *)*puVar8;
  __end2_1 = std::
             vector<Catch::Clara::Detail::HelpColumns,_std::allocator<Catch::Clara::Detail::HelpColumns>_>
             ::begin((vector<Catch::Clara::Detail::HelpColumns,_std::allocator<Catch::Clara::Detail::HelpColumns>_>
                      *)&consoleWidth);
  cols_1 = (HelpColumns *)
           std::
           vector<Catch::Clara::Detail::HelpColumns,_std::allocator<Catch::Clara::Detail::HelpColumns>_>
           ::end((vector<Catch::Clara::Detail::HelpColumns,_std::allocator<Catch::Clara::Detail::HelpColumns>_>
                  *)&consoleWidth);
  while (bVar3 = __gnu_cxx::operator!=
                           (&__end2_1,
                            (__normal_iterator<Catch::Clara::Detail::HelpColumns_*,_std::vector<Catch::Clara::Detail::HelpColumns,_std::allocator<Catch::Clara::Detail::HelpColumns>_>_>
                             *)&cols_1), bVar3) {
    row.m_columns.
    super__Vector_base<Catch::TextFlow::Column,_std::allocator<Catch::TextFlow::Column>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (pointer)__gnu_cxx::
                  __normal_iterator<Catch::Clara::Detail::HelpColumns_*,_std::vector<Catch::Clara::Detail::HelpColumns,_std::allocator<Catch::Clara::Detail::HelpColumns>_>_>
                  ::operator*(&__end2_1);
    TextFlow::Column::Column
              (&local_130,
               (string *)
               row.m_columns.
               super__Vector_base<Catch::TextFlow::Column,_std::allocator<Catch::TextFlow::Column>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
    pCVar9 = TextFlow::Column::width(&local_130,(size_t)__range2);
    pCVar9 = TextFlow::Column::indent(pCVar9,2);
    TextFlow::Spacer(&local_168,4);
    TextFlow::Column::operator+(&local_f8,pCVar9,&local_168);
    TextFlow::Column::Column
              (&local_1a0,
               (string *)
               &(row.m_columns.
                 super__Vector_base<Catch::TextFlow::Column,_std::allocator<Catch::TextFlow::Column>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage)->m_width);
    pCVar9 = TextFlow::Column::width(&local_1a0,(optWidth - (long)__range2) - 7);
    TextFlow::Columns::operator+((Columns *)local_e0,&local_f8,pCVar9);
    TextFlow::Column::~Column(&local_1a0);
    TextFlow::Columns::~Columns(&local_f8);
    TextFlow::Column::~Column(&local_168);
    TextFlow::Column::~Column(&local_130);
    poVar5 = TextFlow::operator<<(os,(Columns *)local_e0);
    std::operator<<(poVar5,'\n');
    TextFlow::Columns::~Columns((Columns *)local_e0);
    __gnu_cxx::
    __normal_iterator<Catch::Clara::Detail::HelpColumns_*,_std::vector<Catch::Clara::Detail::HelpColumns,_std::allocator<Catch::Clara::Detail::HelpColumns>_>_>
    ::operator++(&__end2_1);
  }
  std::vector<Catch::Clara::Detail::HelpColumns,_std::allocator<Catch::Clara::Detail::HelpColumns>_>
  ::~vector((vector<Catch::Clara::Detail::HelpColumns,_std::allocator<Catch::Clara::Detail::HelpColumns>_>
             *)&consoleWidth);
  return;
}

Assistant:

void Parser::writeToStream( std::ostream& os ) const {
            if ( !m_exeName.name().empty() ) {
                os << "usage:\n"
                   << "  " << m_exeName.name() << ' ';
                bool required = true, first = true;
                for ( auto const& arg : m_args ) {
                    if ( first )
                        first = false;
                    else
                        os << ' ';
                    if ( arg.isOptional() && required ) {
                        os << '[';
                        required = false;
                    }
                    os << '<' << arg.hint() << '>';
                    if ( arg.cardinality() == 0 )
                        os << " ... ";
                }
                if ( !required )
                    os << ']';
                if ( !m_options.empty() )
                    os << " options";
                os << "\n\nwhere options are:\n";
            }

            auto rows = getHelpColumns();
            size_t consoleWidth = CATCH_CONFIG_CONSOLE_WIDTH;
            size_t optWidth = 0;
            for ( auto const& cols : rows )
                optWidth = ( std::max )( optWidth, cols.left.size() + 2 );

            optWidth = ( std::min )( optWidth, consoleWidth / 2 );

            for ( auto const& cols : rows ) {
                auto row = TextFlow::Column( cols.left )
                               .width( optWidth )
                               .indent( 2 ) +
                           TextFlow::Spacer( 4 ) +
                           TextFlow::Column( cols.right )
                               .width( consoleWidth - 7 - optWidth );
                os << row << '\n';
            }
        }